

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::addClause(SAT *this,Clause *c,bool one_watch)

{
  int *piVar1;
  char cVar2;
  vec<WatchElem> *pvVar3;
  char cVar4;
  uint uVar5;
  Lit *pLVar6;
  ostream *poVar7;
  mapped_type *this_00;
  uint i_1;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint i;
  uint i_00;
  string asStackY_208 [4];
  int in_stack_fffffffffffffdfc;
  set<int,_std::less<int>,_std::allocator<int>_> levels;
  stringstream s;
  ostream local_1a8 [376];
  
  uVar5 = *(uint *)c >> 8;
  if (uVar5 != 1) {
    if ((*(uint *)c & 1) == 0) {
      if (uVar5 == 3) {
        this->tern_clauses = this->tern_clauses + 1;
      }
      else if (uVar5 == 2) {
        this->bin_clauses = this->bin_clauses + 1;
      }
      else {
        this->long_clauses = this->long_clauses + 1;
      }
    }
    uVar5 = *(uint *)c;
    if ((uVar5 & 1) != 0) {
      for (i_00 = 0; i_00 < uVar5 >> 8; i_00 = i_00 + 1) {
        pLVar6 = Clause::operator[](c,i_00);
        uVar5 = (pLVar6->x >> 1) - this->orig_cutoff;
        if (-1 < (int)uVar5) {
          piVar1 = (this->num_used).data + uVar5;
          *piVar1 = *piVar1 + 1;
        }
        uVar5 = *(uint *)c;
      }
    }
    if (((uVar5 & 0xffffff00) == 0x200) && (((uVar5 & 1) == 0 || (so.bin_clause_opt == true)))) {
      if (!one_watch) {
        pLVar6 = Clause::operator[](c,0);
        uVar5 = pLVar6->x;
        pvVar3 = (this->watches).data;
        pLVar6 = Clause::operator[](c,1);
        _s = (Clause *)(((ulong)(uint)pLVar6->x << 0x20) + 1);
        vec<WatchElem>::push(pvVar3 + ((ulong)uVar5 ^ 1),(WatchElem *)&s);
      }
      pLVar6 = Clause::operator[](c,1);
      uVar5 = pLVar6->x;
      pvVar3 = (this->watches).data;
      pLVar6 = Clause::operator[](c,0);
      _s = (Clause *)(((ulong)(uint)pLVar6->x << 0x20) + 1);
      vec<WatchElem>::push(pvVar3 + ((ulong)uVar5 ^ 1),(WatchElem *)&s);
      if (((ulong)*c & 1) == 0) {
        free(c);
      }
    }
    else {
      if (!one_watch) {
        pLVar6 = Clause::operator[](c,0);
        _s = c;
        vec<WatchElem>::push((this->watches).data + ((ulong)(uint)pLVar6->x ^ 1),(WatchElem *)&s);
      }
      pLVar6 = Clause::operator[](c,1);
      _s = c;
      vec<WatchElem>::push((this->watches).data + ((ulong)(uint)pLVar6->x ^ 1),(WatchElem *)&s);
      (&this->clauses_literals)[*(uint *)c & 1] =
           (&this->clauses_literals)[*(uint *)c & 1] + (ulong)(*(uint *)c >> 8);
      if (((ulong)*c & 1) == 0) {
        _s = c;
        vec<Clause_*>::push(&this->clauses,(Clause **)&s);
      }
      else {
        _s = c;
        vec<Clause_*>::push(&this->learnts,(Clause **)&s);
        if (so.learnt_stats == true) {
          levels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &levels._M_t._M_impl.super__Rb_tree_header._M_header;
          levels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          levels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          levels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar10 = 0;
          levels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               levels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (uVar8 = 0; uVar8 < *(uint *)c >> 8; uVar8 = uVar8 + 1) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &levels,(int *)((long)(this->out_learnt_level).data + lVar10));
            lVar10 = lVar10 + 4;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)&s);
          poVar7 = (ostream *)std::ostream::operator<<(local_1a8,c[1].data[*(uint *)c >> 8].x);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,",");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          if (so.learnt_stats_nogood == true) {
            std::operator<<((ostream *)local_1a8,",");
            for (uVar5 = 0; uVar5 < *(uint *)c >> 8; uVar5 = uVar5 + 1) {
              pcVar9 = " ";
              if (uVar5 == 0) {
                pcVar9 = "";
              }
              poVar7 = std::operator<<((ostream *)local_1a8,pcVar9);
              Clause::operator[](c,uVar5);
              getLitString_abi_cxx11_(in_stack_fffffffffffffdfc);
              std::operator<<(poVar7,asStackY_208);
              std::__cxx11::string::~string(asStackY_208);
            }
          }
          std::__cxx11::stringbuf::str();
          this_00 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&learntClauseString_abi_cxx11_,&c[1].data[*(uint *)c >> 8].x);
          std::__cxx11::string::operator=((string *)this_00,asStackY_208);
          std::__cxx11::string::~string(asStackY_208);
          std::__cxx11::stringstream::~stringstream((stringstream *)&s);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&levels._M_t);
        }
      }
    }
    return;
  }
  pLVar6 = Clause::operator[](c,0);
  cVar2 = (this->assigns).data[(uint)(pLVar6->x >> 1)];
  cVar4 = -cVar2;
  if ((pLVar6->x & 1U) == 0) {
    cVar4 = cVar2;
  }
  if (cVar4 != ::l_False.value) {
    pLVar6 = Clause::operator[](c,0);
    cVar2 = (this->assigns).data[(uint)(pLVar6->x >> 1)];
    cVar4 = -cVar2;
    if ((pLVar6->x & 1U) == 0) {
      cVar4 = cVar2;
    }
    if (cVar4 == ::l_Undef.value) {
      pLVar6 = Clause::operator[](c,0);
      enqueue(this,(Lit)pLVar6->x,(Reason)0x0);
    }
    free(c);
    return;
  }
  puts("=====UNSATISFIABLE=====");
  printf("%% Top level failure!\n");
  exit(0);
}

Assistant:

void SAT::addClause(Clause& c, bool one_watch) {
	assert(c.size() > 0);
	if (c.size() == 1) {
		assert(decisionLevel() == 0);
		if (DEBUG) {
			fprintf(stderr, "warning: adding length 1 clause!\n");
		}
		if (value(c[0]) == l_False) {
			TL_FAIL();
		}
		if (value(c[0]) == l_Undef) {
			enqueue(c[0]);
		}
		free(&c);
		return;
	}
	if (!c.learnt) {
		if (c.size() == 2) {
			bin_clauses++;
		} else if (c.size() == 3) {
			tern_clauses++;
		} else {
			long_clauses++;
		}
	}

	// Mark lazy lits which are used
	if (c.learnt) {
		for (unsigned int i = 0; i < c.size(); i++) {
			incVarUse(var(c[i]));
		}
	}

	if (c.size() == 2 && ((!c.learnt) || (so.bin_clause_opt))) {
		if (!one_watch) {
			watches[toInt(~c[0])].push(c[1]);
		}
		watches[toInt(~c[1])].push(c[0]);
		if (!c.learnt) {
			free(&c);
		}
		return;
	}
	if (!one_watch) {
		watches[toInt(~c[0])].push(&c);
	}
	watches[toInt(~c[1])].push(&c);
	if (c.learnt) {
		learnts_literals += c.size();
	} else {
		clauses_literals += c.size();
	}
	if (c.learnt) {
		learnts.push(&c);
		if (so.learnt_stats) {
			std::set<int> levels;
			for (unsigned int i = 0; i < c.size(); i++) {
				levels.insert(out_learnt_level[i]);
			}
			std::stringstream s;
			//            s << "learntclause,";
			s << c.clauseID() << "," << c.size() << "," << levels.size();
			if (so.learnt_stats_nogood) {
				s << ",";
				for (unsigned int i = 0; i < c.size(); i++) {
					s << (i == 0 ? "" : " ") << getLitString(toInt(c[i]));
					//              s << " (" << out_learnt_level[i] << ")";
				}
			}
			// std::cerr << "\n";
			learntClauseString[c.clauseID()] = s.str();
		}
	} else {
		clauses.push(&c);
	}
}